

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::MethodDescriptorProto::ByteSizeLong(MethodDescriptorProto *this)

{
  bool bVar1;
  int iVar2;
  UnknownFieldSet *unknown_fields;
  string *psVar3;
  size_t sVar4;
  size_t sStack_38;
  int cached_size;
  size_t total_size;
  MethodDescriptorProto *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = MethodDescriptorProto::unknown_fields(this);
    sStack_38 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 0x3f) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      psVar3 = name_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar3);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_input_type(this);
    if (bVar1) {
      psVar3 = input_type_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar3);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_output_type(this);
    if (bVar1) {
      psVar3 = output_type_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar3);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_options(this);
    if (bVar1) {
      sVar4 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::MethodOptions>
                        (this->options_);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_client_streaming(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 2;
    }
    bVar1 = has_server_streaming(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 2;
    }
  }
  iVar2 = internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar2;
  return sStack_38;
}

Assistant:

size_t MethodDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.MethodDescriptorProto)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 63u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional string input_type = 2;
    if (has_input_type()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->input_type());
    }

    // optional string output_type = 3;
    if (has_output_type()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->output_type());
    }

    // optional .google.protobuf.MethodOptions options = 4;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->options_);
    }

    // optional bool client_streaming = 5 [default = false];
    if (has_client_streaming()) {
      total_size += 1 + 1;
    }

    // optional bool server_streaming = 6 [default = false];
    if (has_server_streaming()) {
      total_size += 1 + 1;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}